

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

bool __thiscall FIX::Session::nextQueued(Session *this,SEQNUM num,UtcTimeStamp *now)

{
  SessionState *this_00;
  bool bVar1;
  bool bVar2;
  MsgType *pMVar3;
  unsigned_long value;
  string *__lhs;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  Message msg;
  
  Message::Message(&msg);
  this_00 = &this->m_state;
  bVar1 = SessionState::retrieve(this_00,num,&msg);
  if (bVar1) {
    IntTConvertor<unsigned_long>::convert_abi_cxx11_
              (&local_1c0,(IntTConvertor<unsigned_long> *)num,value);
    std::operator+(&local_1a0,"Processing QUEUED message: ",&local_1c0);
    SessionState::onEvent(this_00,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    pMVar3 = FieldMap::getField<FIX::MsgType>(&msg.m_header.super_FieldMap);
    __lhs = &(pMVar3->super_StringField).super_FieldBase.m_string;
    bVar2 = std::operator==(__lhs,"A");
    if (!bVar2) {
      bVar2 = std::operator==(__lhs,"2");
      if (!bVar2) {
        next(this,&msg,now,true);
        goto LAB_001b20e8;
      }
    }
    SessionState::incrNextTargetMsgSeqNum(this_00);
  }
LAB_001b20e8:
  Message::~Message(&msg);
  return bVar1;
}

Assistant:

bool Session::nextQueued(SEQNUM num, const UtcTimeStamp &now) {
  Message msg;

  if (m_state.retrieve(num, msg)) {
    m_state.onEvent("Processing QUEUED message: " + SEQNUM_CONVERTOR::convert(num));
    auto const &msgType = msg.getHeader().getField<MsgType>();
    if (msgType == MsgType_Logon || msgType == MsgType_ResendRequest) {
      m_state.incrNextTargetMsgSeqNum();
    } else {
      next(msg, now, true);
    }
    return true;
  }
  return false;
}